

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::operator=(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
            *this,vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
                  *other)

{
  optional<std::pair<int,_int>_> *poVar1;
  optional<std::pair<int,_int>_> *poVar2;
  size_t sVar3;
  long lVar4;
  bool *pbVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar1 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar1;
      sVar3 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar3;
      sVar3 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar3;
    }
    else {
      sVar3 = this->nStored;
      if (sVar3 != 0) {
        pbVar5 = &this->ptr->set;
        do {
          if (*pbVar5 == true) {
            *pbVar5 = false;
          }
          pbVar5 = pbVar5 + 0xc;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      this->nStored = 0;
      reserve(this,other->nStored);
      uVar7 = other->nStored;
      if (uVar7 != 0) {
        lVar4 = 8;
        uVar6 = 0;
        do {
          poVar1 = this->ptr;
          poVar2 = other->ptr;
          (poVar1->optionalValue).__data[lVar4] = (poVar2->optionalValue).__data[lVar4];
          if (((poVar2->optionalValue).__data[lVar4] == '\x01') &&
             (*(undefined8 *)((long)poVar1 + lVar4 + -8) =
                   *(undefined8 *)((long)poVar2 + lVar4 + -8),
             (poVar2->optionalValue).__data[lVar4] == '\x01')) {
            (poVar2->optionalValue).__data[lVar4] = '\0';
          }
          uVar6 = uVar6 + 1;
          uVar7 = other->nStored;
          lVar4 = lVar4 + 0xc;
        } while (uVar6 < uVar7);
      }
      this->nStored = uVar7;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }